

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_translate_make(vec4 *m,float *v)

{
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  mat4 t;
  undefined1 local_108 [4];
  undefined4 uStack_104;
  undefined8 uStack_100;
  undefined4 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined8 *local_c0;
  
  local_c0 = in_RDI;
  memset(local_108,0,0x40);
  *local_c0 = CONCAT44(uStack_104,0x3f800000);
  local_c0[1] = uStack_100;
  local_c0[2] = CONCAT44(0x3f800000,local_f8);
  local_c0[3] = uStack_f0;
  local_c0[4] = local_e8;
  local_c0[5] = CONCAT44(uStack_dc,0x3f800000);
  local_c0[6] = local_d8;
  local_c0[7] = CONCAT44(0x3f800000,uStack_d0);
  *(undefined4 *)(in_RDI + 6) = *in_RSI;
  *(undefined4 *)((long)in_RDI + 0x34) = in_RSI[1];
  *(undefined4 *)(in_RDI + 7) = in_RSI[2];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_translate_make(mat4 m, vec3 v) {
  glm_translate_make(m, v);
}